

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

_Bool object_has_property(object *obj,obj_property *prop)

{
  wchar_t flag;
  _Bool _Var1;
  int iVar2;
  obj_property *poVar3;
  bool local_41;
  wchar_t local_24;
  wchar_t idx;
  wchar_t i;
  obj_property *prop_local;
  object *obj_local;
  
  flag = prop->index;
  switch(prop->type) {
  case L'\x01':
  case L'\x02':
    return obj->modifiers[flag] != 0;
  case L'\x03':
    _Var1 = flag_has_dbg(obj->flags,6,flag,"obj->flags","idx");
    return _Var1;
  case L'\x04':
    return obj->el_info[flag].res_level != 100;
  case L'\x05':
    return (obj->el_info[flag].flags & 2) != 0;
  case L'\x06':
    if (obj->brands != (_Bool *)0x0) {
      for (local_24 = L'\x01'; local_24 < (int)(uint)z_info->brand_max;
          local_24 = local_24 + L'\x01') {
        if (((obj->brands[local_24] & 1U) != 0) &&
           (poVar3 = brand_property(local_24), prop == poVar3)) {
          return true;
        }
      }
    }
    break;
  case L'\a':
    if (obj->slays != (_Bool *)0x0) {
      for (local_24 = L'\x01'; local_24 < (int)(uint)z_info->slay_max; local_24 = local_24 + L'\x01'
          ) {
        poVar3 = slay_property(local_24);
        if (prop == poVar3) {
          return true;
        }
      }
    }
    break;
  case L'\b':
    iVar2 = strcmp(prop->name,"enhanced dice");
    if (iVar2 == 0) {
      local_41 = true;
      if ((int)(uint)obj->dd <= obj->kind->dd) {
        local_41 = obj->kind->ds < (int)(uint)obj->ds;
      }
      return local_41;
    }
    iVar2 = strcmp(prop->name,"extra armor");
    if (iVar2 == 0) {
      return obj->kind->ac < (int)obj->ac;
    }
    iVar2 = strcmp(prop->name,"armor bonus");
    if (iVar2 == 0) {
      return obj->to_a != 0;
    }
    iVar2 = strcmp(prop->name,"skill bonus");
    if (iVar2 == 0) {
      return obj->to_h != 0;
    }
    iVar2 = strcmp(prop->name,"deadliness bonus");
    if (iVar2 == 0) {
      return obj->to_d != 0;
    }
  }
  return false;
}

Assistant:

static bool object_has_property(const struct object *obj, struct obj_property *prop)
{
	int i, idx = prop->index;
	switch (prop->type) {
		case OBJ_PROPERTY_STAT :
		case OBJ_PROPERTY_MOD :
		{
			return obj->modifiers[idx] ? true : false;
			break;
		}
		case OBJ_PROPERTY_FLAG :
		{
			return of_has(obj->flags, idx);
			break;
		}
		case OBJ_PROPERTY_ELEMENT :
		{
			return (RES_LEVEL_BASE != obj->el_info[idx].res_level);
			break;
		}
		case OBJ_PROPERTY_IGNORE :
		{
			return obj->el_info[idx].flags & EL_INFO_IGNORE ? true : false;
			break;
		}
		case OBJ_PROPERTY_BRAND :
		{
			if (obj->brands) {
				for (i = 1; i < z_info->brand_max; i++) {
					if (obj->brands[i] && (prop == brand_property(i))) {
						return true;
					}
				}
			}
			break;
		}
		case OBJ_PROPERTY_SLAY :
		{
			if (obj->slays) {
				for (i = 1; i < z_info->slay_max; i++) {
					if (prop == slay_property(i)) {
						return true;
					}
				}
			}
			break;
		}
		case OBJ_PROPERTY_COMBAT :
		{
			if (streq(prop->name, "enhanced dice")) {
				return ((obj->dd > obj->kind->dd) || (obj->ds > obj->kind->ds));
			} else if (streq(prop->name, "extra armor")) {
				return (obj->ac > obj->kind->ac);
			} else if (streq(prop->name, "armor bonus")) {
				return (obj->to_a != 0);
			} else if (streq(prop->name, "skill bonus")) {
				return (obj->to_h != 0);
			} else if (streq(prop->name, "deadliness bonus")) {
				return (obj->to_d != 0);
			}
			break;
		}
		default : break;
	}
	return false;
}